

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char (*in_R8) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  format::string<std::__cxx11::string,char_const[9],char_const(&)[6],char_const(&)[6]>
            (&bStack_28,(format *)"{1} {0}!",(char (*) [9])"world",(char (*) [6])"hello",in_R8);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&bStack_28);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&bStack_28);
  return 0;
}

Assistant:

int main() {
  std::cout << format::string("{1} {0}!", "world", "hello") << "\n";
}